

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void __thiscall Window::_q_filesFound(Window *this)

{
  long lVar1;
  long lVar2;
  char16_t *pcVar3;
  QString *pQVar4;
  Data *pDVar5;
  QFutureWatcher<QList<QString>_> *pQVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  QtConcurrent *this_00;
  WindowPrivate *pWVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  undefined1 auVar14 [12];
  QString path;
  QArrayData *args_2;
  QArrayDataPointer<QString> local_c8;
  QArrayData *local_a8;
  char16_t *local_a0;
  qsizetype local_98;
  undefined1 local_90 [16];
  char16_t *pcStack_80;
  long local_78;
  QString local_68;
  QString local_48;
  QFuture<QList<QString>_> local_30;
  
  pWVar10 = (this->d).d;
  lVar2 = (pWVar10->imageFiles).d.size;
  QFutureInterfaceBase::waitForResult((int)pWVar10 + 0x48);
  plVar8 = (long *)QFutureInterfaceBase::mutex();
  LOCK();
  lVar1 = *plVar8;
  if (lVar1 == 0) {
    *plVar8 = 1;
  }
  UNLOCK();
  if (lVar1 != 0) {
    QBasicMutex::lockInternal();
  }
  iVar7 = QFutureInterfaceBase::resultStoreBase();
  auVar14 = QtPrivate::ResultStoreBase::resultAt(iVar7);
  plVar9 = *(long **)(auVar14._0_8_ + 0x30);
  if (*(int *)(auVar14._0_8_ + 0x28) != 0) {
    plVar9 = (long *)((long)auVar14._8_4_ * 0x18 + plVar9[1]);
  }
  LOCK();
  lVar1 = *plVar8;
  if (lVar1 == 1) {
    *plVar8 = 0;
  }
  UNLOCK();
  if (lVar1 != 1) {
    QBasicMutex::unlockInternal();
  }
  args_2 = (QArrayData *)*plVar9;
  pcVar3 = (char16_t *)plVar9[1];
  lVar1 = plVar9[2];
  if (args_2 != (QArrayData *)0x0) {
    LOCK();
    (args_2->ref_)._q_value.super___atomic_base<int>._M_i =
         (args_2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QList<QString>::operator+=(&((this->d).d)->imageFiles,(QList<QString> *)&stack0xffffffffffffff18);
  QArrayDataPointer<QString>::~QArrayDataPointer
            ((QArrayDataPointer<QString> *)&stack0xffffffffffffff18);
  if (lVar2 == 0) {
    WindowPrivate::loadImages((this->d).d);
  }
  pWVar10 = (this->d).d;
  if ((pWVar10->imageLocations).d.size != 0) {
    pQVar4 = (pWVar10->imageLocations).d.ptr;
    local_a8 = &((pQVar4->d).d)->super_QArrayData;
    local_a0 = (pQVar4->d).ptr;
    local_98 = (pQVar4->d).size;
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pWVar10 = (this->d).d;
    }
    pDVar5 = (pWVar10->imageLocations).d.d;
    if ((pDVar5 == (Data *)0x0) ||
       (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QArrayDataPointer<QString>::reallocateAndGrow
                (&(pWVar10->imageLocations).d,GrowsAtEnd,0,(QArrayDataPointer<QString> *)0x0);
    }
    QtPrivate::QGenericArrayOps<QString>::eraseFirst
              ((QGenericArrayOps<QString> *)&pWVar10->imageLocations);
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    local_c8.size = 0;
    QVar11.m_data = (storage_type *)0x5;
    QVar11.m_size = (qsizetype)&stack0xffffffffffffff18;
    QString::fromUtf8(QVar11);
    local_48.d.d = (Data *)args_2;
    local_48.d.ptr = pcVar3;
    local_48.d.size = lVar1;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,&local_48);
    QVar12.m_data = (storage_type *)0x6;
    QVar12.m_size = (qsizetype)&stack0xffffffffffffff18;
    QString::fromUtf8(QVar12);
    local_68.d.d = (Data *)args_2;
    local_68.d.ptr = pcVar3;
    local_68.d.size = lVar1;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,&local_68);
    QVar13.m_data = (storage_type *)0x5;
    QVar13.m_size = (qsizetype)&stack0xffffffffffffff18;
    QString::fromUtf8(QVar13);
    local_90._8_8_ = args_2;
    pcStack_80 = pcVar3;
    local_78 = lVar1;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_c8,local_c8.size,(QString *)(local_90 + 8));
    local_90._0_8_ = &((this->d).d)->imageLocations;
    this_00 = (QtConcurrent *)QThreadPool::globalInstance();
    QtConcurrent::
    run<QList<QString>(&)(QString_const&,QList<QString>const&,QList<QString>*),QString_const&,QList<QString>&,QList<QString>*>
              (&local_30,this_00,(QThreadPool *)findFiles,
               (_func_QList<QString>_QString_ptr_QList<QString>_ptr_QList<QString>_ptr *)&local_a8,
               (QString *)&local_c8,(QList<QString> *)local_90,(QList<QString> **)args_2);
    local_30.d._8_8_ = 0;
    QFutureInterfaceBase::swap((QFutureInterfaceBase *)&((this->d).d)->fileFuture);
    QFutureInterface<QList<QString>_>::~QFutureInterface
              ((QFutureInterface<QList<QString>_> *)&stack0xffffffffffffff18);
    QFutureInterface<QList<QString>_>::~QFutureInterface(&local_30.d);
    if ((QArrayData *)local_90._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_90._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_90._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_90._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_90._8_8_,2,8);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
    pWVar10 = (this->d).d;
    pQVar6 = pWVar10->filesFutureWatcher;
    if (*(long *)&(pWVar10->fileFuture).d.field_0x8 != *(long *)&(pQVar6->m_future).d.field_0x8) {
      QFutureWatcherBase::disconnectOutputInterface(SUB81(pQVar6,0));
      QFutureInterface<QList<QString>_>::operator=(&(pQVar6->m_future).d,&(pWVar10->fileFuture).d);
      QFutureWatcherBase::connectOutputInterface();
    }
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,8);
      }
    }
  }
  return;
}

Assistant:

void
Window::_q_filesFound()
{
	const bool start = d->imageFiles.isEmpty();

	d->imageFiles += d->fileFuture.result();

	if( start )
		d->loadImages();

	if( !d->imageLocations.isEmpty() )
	{
		const QString path = d->imageLocations.at( 0 );
		d->imageLocations.removeFirst();

		d->fileFuture = QtConcurrent::run(
			findFiles, path,
			QStringList() << "*.jpg" << "*.jpeg" << "*.png",
			&d->imageLocations );

		d->filesFutureWatcher->setFuture( d->fileFuture );
	}
}